

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

double cvui::internal::counter
                 (cvui_block_t *theBlock,int theX,int theY,double *theValue,double theStep,
                 char *theFormat)

{
  bool bVar1;
  int theX_00;
  Size_<int> local_d4;
  Size_<int> local_cc;
  Size aSize;
  allocator<char> local_99;
  String local_98;
  allocator<char> local_61;
  String local_60;
  undefined1 local_40 [8];
  Rect aContentArea;
  char *theFormat_local;
  double theStep_local;
  double *theValue_local;
  int theY_local;
  int theX_local;
  cvui_block_t *theBlock_local;
  
  aContentArea._8_8_ = theFormat;
  cv::Rect_<int>::Rect_((Rect_<int> *)local_40,theX + 0x16,theY,0x30,0x16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"-",&local_61);
  bVar1 = button(theBlock,theX,theY,0x16,0x16,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (bVar1) {
    *theValue = *theValue - theStep;
  }
  sprintf(gBuffer,(char *)aContentArea._8_8_,*theValue);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,gBuffer,&local_99);
  render::counter(theBlock,(Rect *)local_40,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  theX_00 = local_40._0_4_ + aContentArea.x;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aSize.height,"+",(allocator<char> *)((long)&aSize.width + 3));
  bVar1 = button(theBlock,theX_00,theY,0x16,0x16,(String *)&aSize.height,false);
  std::__cxx11::string::~string((string *)&aSize.height);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aSize.width + 3));
  if (bVar1) {
    *theValue = theStep + *theValue;
  }
  cv::Size_<int>::Size_(&local_cc,aContentArea.x + 0x2c,aContentArea.y);
  cv::Size_<int>::Size_(&local_d4,&local_cc);
  updateLayoutFlow(theBlock,&local_d4);
  return *theValue;
}

Assistant:

double counter(cvui_block_t& theBlock, int theX, int theY, double *theValue, double theStep, const char *theFormat) {
		cv::Rect aContentArea(theX + 22, theY, 48, 22);

		if (internal::button(theBlock, theX, theY, 22, 22, "-", false)) {
			*theValue -= theStep;
		}

		sprintf_s(internal::gBuffer, theFormat, *theValue);
		render::counter(theBlock, aContentArea, internal::gBuffer);

		if (internal::button(theBlock, aContentArea.x + aContentArea.width, theY, 22, 22, "+", false)) {
			*theValue += theStep;
		}

		// Update the layout flow
		cv::Size aSize(22 * 2 + aContentArea.width, aContentArea.height);
		updateLayoutFlow(theBlock, aSize);

		return *theValue;
	}